

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_237::InfoCollector::receiveChildValue
          (InfoCollector *this,Expression *child,Expression *parent)

{
  SmallVector<wasm::Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>::Task,_10UL>
  *this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Index i;
  Index IVar4;
  ulong uVar5;
  _Variadic_union<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  local_90;
  undefined1 local_70;
  Expression *local_68;
  Index local_60;
  undefined1 local_48;
  InfoCollector *local_40;
  InfoCollector *local_38;
  
  local_40 = this;
  local_38 = (InfoCollector *)child;
  bVar1 = isRelevant((InfoCollector *)parent,child);
  if (bVar1) {
    bVar1 = isRelevant(local_38,child);
    if (bVar1) {
      this_00 = &(local_38->
                 super_PostWalker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                 ).
                 super_Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                 .stack;
      sVar2 = wasm::Type::size((Type *)this_00);
      sVar3 = wasm::Type::size(&parent->type);
      if (sVar2 != sVar3) {
        __assert_fail("child->type.size() == parent->type.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                      ,0x4da,
                      "void wasm::(anonymous namespace)::InfoCollector::receiveChildValue(Expression *, Expression *)"
                     );
      }
      uVar5 = 0;
      while( true ) {
        IVar4 = (Index)uVar5;
        sVar2 = wasm::Type::size((Type *)this_00);
        if (sVar2 <= uVar5) break;
        local_90._M_first._M_storage.expr = (Expression *)local_38;
        local_70 = 0;
        local_48 = 0;
        local_90._M_first._M_storage.tupleIndex = IVar4;
        local_68 = parent;
        local_60 = IVar4;
        std::
        vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
        ::push_back(&local_40->info->links,(value_type *)&local_90._M_first);
        uVar5 = (ulong)(IVar4 + 1);
      }
    }
  }
  return;
}

Assistant:

void receiveChildValue(Expression* child, Expression* parent) {
    if (isRelevant(parent) && isRelevant(child)) {
      // The tuple sizes must match (or, if not a tuple, the size should be 1 in
      // both cases).
      assert(child->type.size() == parent->type.size());
      for (Index i = 0; i < child->type.size(); i++) {
        info.links.push_back(
          {ExpressionLocation{child, i}, ExpressionLocation{parent, i}});
      }
    }
  }